

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O1

REF_STATUS ref_export_bamg_msh(REF_GRID ref_grid,char *filename)

{
  REF_NODE pRVar1;
  REF_GLOB *pRVar2;
  REF_CELL pRVar3;
  bool bVar4;
  REF_STATUS RVar5;
  FILE *__s;
  void *__ptr;
  long lVar6;
  void *__ptr_00;
  ulong uVar7;
  int cell;
  char *pcVar8;
  REF_STATUS unaff_R12D;
  int iVar9;
  ulong uVar10;
  REF_INT nodes [27];
  int local_d4;
  int local_a8;
  int local_a4;
  uint local_a0;
  uint local_9c;
  
  if (ref_grid->twod == 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x836,
           "ref_export_bamg_msh","expected twod convention grid");
    return 1;
  }
  pRVar1 = ref_grid->node;
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x83a,
           "ref_export_bamg_msh","unable to open file");
    return 2;
  }
  fwrite("MeshVersionFormatted 0\n\n",0x18,1,__s);
  fwrite("Dimension 2\n\n",0xd,1,__s);
  if ((long)pRVar1->max < 0) {
    unaff_R12D = 1;
    pcVar8 = "malloc o2n of REF_INT negative";
LAB_0011775b:
    bVar4 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x83f,
           "ref_export_bamg_msh",pcVar8);
    __ptr = (void *)0x0;
  }
  else {
    __ptr = malloc((long)pRVar1->max << 2);
    if (__ptr == (void *)0x0) {
      unaff_R12D = 2;
      pcVar8 = "malloc o2n of REF_INT NULL";
      goto LAB_0011775b;
    }
    bVar4 = true;
    if (0 < pRVar1->max) {
      lVar6 = 0;
      do {
        *(undefined4 *)((long)__ptr + lVar6 * 4) = 0xffffffff;
        lVar6 = lVar6 + 1;
      } while (lVar6 < pRVar1->max);
    }
  }
  if (!bVar4) {
    return unaff_R12D;
  }
  if ((long)pRVar1->max < 0) {
    unaff_R12D = 1;
    pcVar8 = "malloc n2o of REF_INT negative";
  }
  else {
    __ptr_00 = malloc((long)pRVar1->max << 2);
    if (__ptr_00 != (void *)0x0) {
      bVar4 = true;
      if (0 < pRVar1->max) {
        lVar6 = 0;
        do {
          *(undefined4 *)((long)__ptr_00 + lVar6 * 4) = 0xffffffff;
          lVar6 = lVar6 + 1;
        } while (lVar6 < pRVar1->max);
      }
      goto LAB_00117801;
    }
    unaff_R12D = 2;
    pcVar8 = "malloc n2o of REF_INT NULL";
  }
  bVar4 = false;
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x840,
         "ref_export_bamg_msh",pcVar8);
  __ptr_00 = (void *)0x0;
LAB_00117801:
  if (bVar4) {
    if (pRVar1->max < 1) {
      uVar10 = 0;
    }
    else {
      pRVar2 = pRVar1->global;
      lVar6 = 0;
      uVar10 = 0;
      do {
        if (-1 < pRVar2[lVar6]) {
          iVar9 = (int)uVar10;
          *(int *)((long)__ptr + lVar6 * 4) = iVar9;
          *(int *)((long)__ptr_00 + (long)iVar9 * 4) = (int)lVar6;
          uVar10 = (ulong)(iVar9 + 1);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < pRVar1->max);
    }
    local_d4 = 0;
    fprintf(__s,"\nVertices\n%d\n",uVar10);
    if (0 < (int)uVar10) {
      uVar7 = 0;
      do {
        lVar6 = (long)*(int *)((long)__ptr_00 + uVar7 * 4);
        fprintf(__s,"%.16E %.16E %d\n",pRVar1->real[lVar6 * 0xf],pRVar1->real[lVar6 * 0xf + 2],1);
        uVar7 = uVar7 + 1;
      } while (uVar10 != uVar7);
    }
    pRVar3 = ref_grid->cell[0];
    fprintf(__s,"\nEdges\n%d\n",(ulong)(uint)pRVar3->n);
    if (0 < pRVar3->max) {
      local_d4 = 0;
      iVar9 = 0;
      do {
        RVar5 = ref_cell_nodes(pRVar3,iVar9,&local_a8);
        if (RVar5 == 0) {
          local_d4 = local_d4 + 1;
          fprintf(__s,"%d %d %d\n",(ulong)(*(int *)((long)__ptr + (long)local_a8 * 4) + 1),
                  (ulong)(*(int *)((long)__ptr + (long)local_a4 * 4) + 1),(ulong)local_a0);
        }
        iVar9 = iVar9 + 1;
      } while (iVar9 < pRVar3->max);
    }
    if (local_d4 == pRVar3->n) {
      pRVar3 = ref_grid->cell[3];
      iVar9 = 0;
      fprintf(__s,"\nTriangles\n%d\n",(ulong)(uint)pRVar3->n);
      if (0 < pRVar3->max) {
        iVar9 = 0;
        cell = 0;
        do {
          RVar5 = ref_cell_nodes(pRVar3,cell,&local_a8);
          if (RVar5 == 0) {
            iVar9 = iVar9 + 1;
            fprintf(__s,"%d %d %d %d\n",(ulong)(*(int *)((long)__ptr + (long)local_a8 * 4) + 1),
                    (ulong)(*(int *)((long)__ptr + (long)(int)local_a0 * 4) + 1),
                    (ulong)(*(int *)((long)__ptr + (long)local_a4 * 4) + 1),(ulong)local_9c);
          }
          cell = cell + 1;
        } while (cell < pRVar3->max);
      }
      if (iVar9 == pRVar3->n) {
        if (__ptr_00 != (void *)0x0) {
          free(__ptr_00);
        }
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
        fclose(__s);
        unaff_R12D = 0;
      }
      else {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0x860,"ref_export_bamg_msh","triangle miscount",(long)iVar9,(long)pRVar3->n);
        unaff_R12D = 1;
      }
    }
    else {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x856,"ref_export_bamg_msh","edge/quad miscount",(long)local_d4,(long)pRVar3->n);
      unaff_R12D = 1;
    }
  }
  return unaff_R12D;
}

Assistant:

REF_FCN static REF_STATUS ref_export_bamg_msh(REF_GRID ref_grid,
                                              const char *filename) {
  FILE *f;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node;
  REF_INT *o2n, *n2o;
  REF_INT nnode;
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT nedge;
  REF_INT ntri;

  RAS(ref_grid_twod(ref_grid), "expected twod convention grid");

  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  fprintf(f, "MeshVersionFormatted 0\n\n");
  fprintf(f, "Dimension 2\n\n");

  ref_malloc_init(o2n, ref_node_max(ref_node), REF_INT, REF_EMPTY);
  ref_malloc_init(n2o, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  nnode = 0;
  each_ref_node_valid_node(ref_node, node) {
    o2n[node] = nnode;
    n2o[nnode] = node;
    nnode++;
  }

  fprintf(f, "\nVertices\n%d\n", nnode);
  for (node = 0; node < nnode; node++) {
    fprintf(f, "%.16E %.16E %d\n", ref_node_xyz(ref_node, 0, n2o[node]),
            ref_node_xyz(ref_node, 2, n2o[node]), 1);
  }

  ref_cell = ref_grid_edg(ref_grid);
  fprintf(f, "\nEdges\n%d\n", ref_cell_n(ref_cell));
  nedge = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    nedge++;
    fprintf(f, "%d %d %d\n", o2n[nodes[0]] + 1, o2n[nodes[1]] + 1, nodes[2]);
  }
  REIS(nedge, ref_cell_n(ref_cell), "edge/quad miscount");

  ref_cell = ref_grid_tri(ref_grid);
  fprintf(f, "\nTriangles\n%d\n", ref_cell_n(ref_cell));
  ntri = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    ntri++;
    fprintf(f, "%d %d %d %d\n", o2n[nodes[0]] + 1, o2n[nodes[2]] + 1,
            o2n[nodes[1]] + 1, nodes[3]);
  }
  REIS(ntri, ref_cell_n(ref_cell), "triangle miscount");

  ref_free(n2o);
  ref_free(o2n);

  fclose(f);

  return REF_SUCCESS;
}